

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateManager.cpp
# Opt level: O1

void __thiscall
TemplateManager::GetTemplates
          (TemplateManager *this,TYPE_ID s,KEY_ID p,TYPE_ID o,unsigned_short scope,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *tripleTmpl)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  iterator iVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  _Self __tmp;
  _Rb_tree_header *p_Var7;
  undefined2 in_register_00000082;
  _Self __tmp_1;
  bool bVar8;
  undefined1 local_78 [8];
  TripleTemplate tmp;
  _Self __tmp_2;
  __hashtable *__h;
  __node_gen_type __node_gen;
  
  __node_gen._M_h._4_4_ = CONCAT22(in_register_00000082,scope);
  local_78 = (undefined1  [8])0x0;
  tmp.ID._0_4_ = s;
  tmp._8_8_ = p;
  tmp.predicateID._0_4_ = o;
  tmp.predicateID._4_2_ = scope;
  if (((p == 0xffffffffffffffff) || (s == 0xffffffff)) || (o == 0xffffffff)) {
    for (tmp._24_8_ = (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)tmp._24_8_ != &(this->templates)._M_t._M_impl.super__Rb_tree_header;
        tmp._24_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)tmp._24_8_)) {
      p_Var3 = (_Rb_tree_node_base *)(tmp._24_8_ + 0x20);
      for (p_Var5 = *(_Rb_tree_node_base **)(tmp._24_8_ + 0x40);
          p_Var5 != (_Rb_tree_node_base *)&p_Var3->_M_left;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        if (((((s == 0xffffffff) || (*(TYPE_ID *)&p_Var5[1]._M_parent == s)) &&
             ((o == 0xffffffff || (*(TYPE_ID *)&p_Var5[1]._M_right == o)))) &&
            ((p == 0xffffffffffffffff || (p_Var5[1]._M_left == (_Base_ptr)p)))) &&
           (*(short *)((long)&p_Var5[1]._M_right + 4) == (short)__node_gen._M_h._4_4_)) {
          __h = &tripleTmpl->_M_h;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)tripleTmpl,p_Var5 + 1,&__h);
        }
      }
    }
  }
  else {
    p_Var1 = &(this->templates)._M_t._M_impl.super__Rb_tree_header;
    if (scope == 0) {
      p_Var2 = (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0; p_Var2 = (&p_Var2->_M_left)[bVar8]
          ) {
        bVar8 = (uint)*(size_t *)(p_Var2 + 1) < s;
        if (!bVar8) {
          p_Var6 = p_Var2;
        }
      }
      p_Var7 = p_Var1;
      if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
         (p_Var7 = (_Rb_tree_header *)p_Var6, s < (uint)((_Rb_tree_header *)p_Var6)->_M_node_count))
      {
        p_Var7 = p_Var1;
      }
      if ((p_Var7 != p_Var1) &&
         (iVar4 = std::
                  _Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                  ::find((_Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                          *)(p_Var7 + 1),(key_type *)local_78),
         iVar4._M_node != (_Base_ptr)((long)(p_Var7 + 1) + 8))) {
        __h = &tripleTmpl->_M_h;
        std::
        _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                  ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)tripleTmpl,iVar4._M_node + 1);
      }
    }
    else {
      p_Var5 = (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var5 != p_Var1) {
        do {
          iVar4 = std::
                  _Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                  ::find((_Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                          *)&p_Var5[1]._M_parent,(key_type *)local_78);
          if (iVar4._M_node != (_Base_ptr)&p_Var5[1]._M_left) {
            __h = &tripleTmpl->_M_h;
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)tripleTmpl,iVar4._M_node + 1,&__h);
          }
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while ((_Rb_tree_header *)p_Var5 != p_Var1);
      }
    }
  }
  return;
}

Assistant:

void TemplateManager::GetTemplates(TYPE_ID s, KEY_ID p, TYPE_ID o, unsigned short int scope, unordered_set<size_t>* tripleTmpl) {

	map<TYPE_ID, set<TripleTemplate> >::iterator it_templates;
	set<TripleTemplate>::iterator it_triple;

	TripleTemplate tmp;
	tmp.subjectType = s;
	tmp.predicateID = p;
	tmp.objectType = o;
	tmp.scope = scope;

	if (s != (TYPE_ID) -1 and o != (TYPE_ID) -1 and p != (KEY_ID) -1) { //FIXME, this is kinda hack, should find better way for wildcards
		if (scope == 0 and s != (TYPE_ID) -1) {
			it_templates = templates.find(s);
			if (it_templates != templates.end()) {
				it_triple = it_templates->second.find(tmp);
				if (it_triple != it_templates->second.end()) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		} else {
			for (it_templates = templates.begin(); it_templates != templates.end(); it_templates++) {
				it_triple = it_templates->second.find(tmp);
				if (it_triple != it_templates->second.end()) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		}
	} else {
		//FIXME this is a "slow" hack, find a "normal" solution to work with wildcards
//		cerr << "nie jest zle\ts:" << s << "\to: " << o << endl;
		for (it_templates = templates.begin(); it_templates != templates.end(); it_templates++) {
			for (it_triple = it_templates->second.begin(); it_triple != it_templates->second.end(); it_triple++) {
				if ((it_triple->subjectType == s or s == (TYPE_ID) -1) and (it_triple->objectType == o or o == (TYPE_ID) -1) and (it_triple->predicateID == p or p == (KEY_ID) -1)
						and it_triple->scope == scope) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		}

	}

}